

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleList::child(QAccessibleList *this,int logicalIndex)

{
  ChildCache *this_00;
  Span *pSVar1;
  int iVar2;
  uint uVar3;
  Role role_;
  QAbstractItemView *this_01;
  QAbstractItemModel *pQVar4;
  QAccessibleTableCell *this_02;
  QListView *this_03;
  ulong uVar5;
  long in_FS_OFFSET;
  const_iterator cVar6;
  uint local_98 [6];
  char *local_80;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  int logicalIndex_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  logicalIndex_local = logicalIndex;
  this_01 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
  if (this_01 != (QAbstractItemView *)0x0) {
    pQVar4 = QAbstractItemView::model(this_01);
    if (pQVar4 != (QAbstractItemModel *)0x0) {
      iVar2 = (**(code **)(*(long *)&this->super_QAccessibleTable + 0x58))(this);
      if (iVar2 != 0) {
        this_00 = &(this->super_QAccessibleTable).childToId;
        cVar6 = QHash<int,_unsigned_int>::constFindImpl<int>(this_00,&logicalIndex_local);
        if (cVar6.i.d == (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 && cVar6.i.bucket == 0)
        {
          this_03 = QtPrivate::qobject_cast_helper<QListView_const*,QObject>((QObject *)this_01);
          iVar2 = logicalIndex_local;
          uVar3 = QListView::modelColumn(this_03);
          local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_01);
          local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.r = -0x55555556;
          local_78.c = -0x55555556;
          local_78.i._0_4_ = 0xaaaaaaaa;
          local_78.i._4_4_ = 0xaaaaaaaa;
          (**(code **)(*(long *)pQVar4 + 0x60))
                    (&local_78,pQVar4,iVar2,uVar3,(QModelIndex *)&local_58);
          if (((local_78.r < 0) || (local_78.c < 0)) ||
             (local_78.m.ptr == (QAbstractItemModel *)0x0)) {
            local_98[0] = 2;
            local_98[5] = 0;
            local_98[1] = 0;
            local_98[2] = 0;
            local_98[3] = 0;
            local_98[4] = 0;
            local_80 = "default";
            this_02 = (QAccessibleTableCell *)0x0;
            QMessageLogger::warning
                      ((char *)local_98,"QAccessibleList::child: Invalid index at: %d %d",
                       (ulong)(uint)iVar2,(ulong)uVar3);
          }
          else {
            this_02 = (QAccessibleTableCell *)operator_new(0x38);
            role_ = QAccessibleTable::cellRole(&this->super_QAccessibleTable);
            QAccessibleTableCell::QAccessibleTableCell
                      (this_02,(QAbstractItemView *)this_01,&local_78,role_);
            QAccessible::registerAccessibleInterface((QAccessibleInterface *)this_02);
            local_98[0] = QAccessible::uniqueId((QAccessibleInterface *)this_02);
            QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                      ((QHash<int,unsigned_int> *)this_00,&logicalIndex_local,local_98);
          }
        }
        else {
          pSVar1 = (cVar6.i.d)->spans;
          uVar5 = cVar6.i.bucket >> 7;
          this_02 = (QAccessibleTableCell *)
                    QAccessible::accessibleInterface
                              (*(uint *)(pSVar1[uVar5].entries
                                         [pSVar1[uVar5].offsets[(uint)cVar6.i.bucket & 0x7f]].
                                         storage.data + 4));
        }
        goto LAB_004dc9e6;
      }
    }
  }
  this_02 = (QAccessibleTableCell *)0x0;
LAB_004dc9e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return &this_02->super_QAccessibleInterface;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleList::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;

    if (columnCount() == 0) {
        return nullptr;
    }

    const auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    const QListView *listView = qobject_cast<const QListView*>(theView);
    Q_ASSERT(listView);
    int row = logicalIndex;
    int column = listView->modelColumn();

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(row, column, rootIndex);
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning("QAccessibleList::child: Invalid index at: %d %d", row, column);
        return nullptr;
    }
    const auto iface = new QAccessibleTableCell(theView, index, cellRole());

    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}